

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

uint64_t __thiscall google::protobuf::internal::ThreadSafeArena::SpaceUsed(ThreadSafeArena *this)

{
  SerialArenaChunk *this_00;
  SerialArena *this_01;
  uint64_t uVar1;
  uint64_t uVar2;
  long lVar3;
  Span<const_std::atomic<google::protobuf::internal::SerialArena_*>_> SVar4;
  
  uVar1 = SerialArena::SpaceUsed(&this->first_arena_);
  this_00 = (this->head_)._M_b._M_p;
  while( true ) {
    if (((ulong)this_00 & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                    ,0x1fe,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long>, OffsetSeq = std::integer_sequence<unsigned long, 0>, N = 0UL, Char = const char]"
                   );
    }
    if (*(int *)(this_00 + 8) == 0) break;
    SVar4 = SerialArenaChunk::arenas(this_00);
    if (SVar4.len_ != 0) {
      lVar3 = 0;
      do {
        this_01 = *(SerialArena **)((long)&((SVar4.ptr_)->_M_b)._M_p + lVar3);
        if (this_01 != (SerialArena *)0x0) {
          uVar2 = SerialArena::SpaceUsed(this_01);
          uVar1 = (uVar1 + uVar2) - 0x78;
        }
        lVar3 = lVar3 + 8;
      } while (SVar4.len_ << 3 != lVar3);
    }
    this_00 = *(SerialArenaChunk **)this_00;
  }
  return ((ulong)((this->alloc_policy_).policy_ < 8) * 0x20 + uVar1) - 0x20;
}

Assistant:

uint64_t ThreadSafeArena::SpaceUsed() const {
  // `first_arena_` doesn't have kSerialArenaSize overhead, so adjust it here.
  uint64_t space_used = kSerialArenaSize;
  VisitSerialArena([&space_used](const SerialArena* serial) {
    // SerialArena on chunks directly allocated from the block and needs to be
    // subtracted from SpaceUsed.
    space_used += serial->SpaceUsed() - kSerialArenaSize;
  });
  return space_used - (alloc_policy_.get() ? sizeof(AllocationPolicy) : 0);
}